

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O2

t_int * tabreceive_perform(t_int *w)

{
  int iVar1;
  undefined4 *puVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  puVar2 = (undefined4 *)w[2];
  lVar5 = *(long *)(w[1] + 0x30);
  iVar3 = (int)w[3];
  if (lVar5 == 0) {
    for (lVar5 = 0; iVar3 != (int)lVar5; lVar5 = lVar5 + 1) {
      puVar2[lVar5] = 0;
    }
  }
  else {
    iVar1 = *(int *)(w[1] + 0x40);
    lVar6 = (long)iVar1;
    if ((long)iVar3 < (long)iVar1) {
      lVar6 = (long)iVar3;
    }
    for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
      *puVar2 = *(undefined4 *)(lVar5 + lVar7 * 8);
      puVar2 = puVar2 + 1;
    }
    if (iVar3 - iVar1 != 0 && iVar1 <= iVar3) {
      for (uVar4 = 0; (uint)(iVar3 - iVar1) != uVar4; uVar4 = uVar4 + 1) {
        puVar2[uVar4] = 0;
      }
    }
  }
  return w + 4;
}

Assistant:

static t_int *tabreceive_perform(t_int *w)
{
    t_tabreceive *x = (t_tabreceive *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    t_word *from = x->x_vec;
    if (from)
    {
        t_int vecsize = x->x_npoints;
        if (vecsize > n)
            vecsize = n;
        while (vecsize--)
            *out++ = (from++)->w_float;
        vecsize = n - x->x_npoints;
        if (vecsize > 0)
            while (vecsize--)
                *out++ = 0;
    }
    else while (n--) *out++ = 0;
    return (w+4);
}